

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O2

sockaddr_in __thiscall ServerService::initBroadcast(ServerService *this,int port)

{
  int iVar1;
  ostream *poVar2;
  sockaddr_in sVar3;
  int opt;
  
  iVar1 = socket(2,2,0);
  this->broadcastFD = iVar1;
  if (iVar1 == -1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Create Broadcast Socket Fail");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = 1;
  }
  else {
    iVar1 = setsockopt(iVar1,1,6,&opt,4);
    if (iVar1 != -1) {
      sVar3._0_8_ = (ulong)(ushort)((ushort)port << 8 | (ushort)port >> 8) << 0x10 |
                    0xffffffff00000002;
      sVar3.sin_zero[0] = '\0';
      sVar3.sin_zero[1] = '\0';
      sVar3.sin_zero[2] = '\0';
      sVar3.sin_zero[3] = '\0';
      sVar3.sin_zero[4] = '\0';
      sVar3.sin_zero[5] = '\0';
      sVar3.sin_zero[6] = '\0';
      sVar3.sin_zero[7] = '\0';
      return sVar3;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Set Socket To Broadcast Format Fail");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = 2;
  }
  exit(iVar1);
}

Assistant:

struct sockaddr_in ServerService::initBroadcast(int port) {
    struct sockaddr_in peerAddr;
    const int opt = 1;
    int ret = 0;

    bzero(&peerAddr, sizeof(struct sockaddr_in));
    peerAddr.sin_family = AF_INET;
    peerAddr.sin_port = htons(port);
    peerAddr.sin_addr.s_addr = htonl(INADDR_BROADCAST);

    broadcastFD = socket(AF_INET, SOCK_DGRAM, 0);
    if (broadcastFD == -1) {
        cout << "Create Broadcast Socket Fail" << endl;
        exit(1);
    }

    ret = setsockopt(broadcastFD, SOL_SOCKET, SO_BROADCAST, (char *)&opt, sizeof(opt));
    if (ret == -1) {
        cout << "Set Socket To Broadcast Format Fail" << endl;
        exit(2);
    }
    return peerAddr;
}